

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::AOIntegrator::Li
          (AOIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,SamplerHandle *sampler
          ,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  array<float,_4> aVar13;
  bool bVar14;
  int __x;
  long in_RDI;
  Point2f PVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 extraout_XMM0_Qb;
  Vector3<float> VVar18;
  Normal3<float> NVar19;
  Vector3f VVar20;
  SampledSpectrum SVar21;
  Ray r;
  Frame f;
  Point2f u;
  Float pdf;
  Vector3f wi;
  Vector3f t;
  Vector3f s;
  Normal3f n;
  BSDF bsdf;
  SurfaceInteraction *isect;
  optional<pbrt::ShapeIntersection> si;
  SampledSpectrum L;
  Ray *in_stack_fffffffffffff9c8;
  Ray *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  Float in_stack_fffffffffffff9dc;
  optional<pbrt::ShapeIntersection> *in_stack_fffffffffffff9e0;
  Integrator *in_stack_fffffffffffff9e8;
  Normal3<float> *in_stack_fffffffffffff9f0;
  Vector3f *in_stack_fffffffffffffa10;
  Interaction *in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa68;
  Float in_stack_fffffffffffffa6c;
  Float in_stack_fffffffffffffa70;
  Float in_stack_fffffffffffffa74;
  undefined4 uStack_550;
  Float in_stack_fffffffffffffab4;
  RayDifferential *in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  undefined8 local_364;
  float local_35c;
  undefined8 local_358;
  Float local_350;
  undefined8 local_348;
  float local_340;
  undefined8 local_338;
  float local_330;
  undefined8 local_328;
  float local_320;
  undefined8 local_318;
  float local_310;
  undefined8 local_308;
  float local_300;
  undefined8 local_2f8;
  float local_2f0;
  undefined8 local_2e8;
  float local_2e0;
  undefined8 local_2d8;
  float local_2d0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  in_stack_fffffffffffffd58;
  CameraHandle *in_stack_fffffffffffffd60;
  SampledWavelengths *in_stack_fffffffffffffd68;
  RayDifferential *in_stack_fffffffffffffd70;
  SurfaceInteraction *in_stack_fffffffffffffd78;
  SamplerHandle *in_stack_fffffffffffffd90;
  optional<pbrt::ShapeIntersection> local_158;
  undefined8 local_10;
  undefined8 local_8;
  
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_fffffffffffff9d0,
             (Float)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
  pstd::optional<pbrt::ShapeIntersection>::optional(&local_158);
  do {
    uVar16 = 0;
    Integrator::Intersect
              (in_stack_fffffffffffff9e8,(Ray *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc)
    ;
    pstd::optional<pbrt::ShapeIntersection>::operator=
              (in_stack_fffffffffffff9e0,
               (optional<pbrt::ShapeIntersection> *)
               CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    pstd::optional<pbrt::ShapeIntersection>::~optional
              ((optional<pbrt::ShapeIntersection> *)0x7eb530);
    bVar14 = pstd::optional::operator_cast_to_bool((optional *)&local_158);
    if (!bVar14) {
LAB_007ebc5f:
      SampledSpectrum::SampledSpectrum
                ((SampledSpectrum *)in_stack_fffffffffffff9d0,
                 (Float)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
LAB_007ebc7d:
      pstd::optional<pbrt::ShapeIntersection>::~optional
                ((optional<pbrt::ShapeIntersection> *)0x7ebc8a);
      aVar13.values[2] = (float)(undefined4)local_8;
      aVar13.values[3] = (float)local_8._4_4_;
      aVar13.values[0] = (float)(undefined4)local_10;
      aVar13.values[1] = (float)local_10._4_4_;
      return (array<float,_4>)(array<float,_4>)aVar13.values;
    }
    pstd::optional<pbrt::ShapeIntersection>::operator->
              ((optional<pbrt::ShapeIntersection> *)0x7eb563);
    CameraHandle::CameraHandle
              ((CameraHandle *)in_stack_fffffffffffff9d0,(CameraHandle *)in_stack_fffffffffffff9c8);
    SamplerHandle::SamplerHandle
              ((SamplerHandle *)in_stack_fffffffffffff9d0,(SamplerHandle *)in_stack_fffffffffffff9c8
              );
    in_stack_fffffffffffff9c8 = (Ray *)&stack0xfffffffffffffd38;
    SurfaceInteraction::GetBSDF
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               in_stack_fffffffffffffd60,(ScratchBuffer *)in_stack_fffffffffffffd58.bits,
               in_stack_fffffffffffffd90);
    bVar14 = BSDF::operator_cast_to_bool((BSDF *)0x7eb631);
    if (bVar14) {
      VVar18 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff9d0);
      local_2f0 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
      uVar17 = 0;
      auVar12._8_8_ = uVar16;
      auVar12._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_2f8 = vmovlpd_avx(auVar12);
      local_2e8 = local_2f8;
      local_2e0 = local_2f0;
      NVar19 = FaceForward<float>(in_stack_fffffffffffff9f0,
                                  (Vector3<float> *)in_stack_fffffffffffff9e8);
      local_300 = NVar19.super_Tuple3<pbrt::Normal3,_float>.z;
      uVar16 = 0;
      auVar11._8_8_ = uVar17;
      auVar11._0_8_ = NVar19.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      local_308 = vmovlpd_avx(auVar11);
      local_2d8 = local_308;
      local_2d0 = local_300;
      VVar18 = Normalize<float>((Vector3<float> *)in_stack_fffffffffffff9f0);
      local_320 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
      uVar17 = 0;
      auVar10._8_8_ = uVar16;
      auVar10._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_328 = vmovlpd_avx(auVar10);
      local_318 = local_328;
      local_310 = local_320;
      VVar18 = Cross<float>((Normal3<float> *)in_stack_fffffffffffff9e0,
                            (Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
      local_340 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
      uStack_550 = (undefined4)uVar17;
      auVar9._8_4_ = uStack_550;
      auVar9._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar9._12_4_ = (int)((ulong)uVar17 >> 0x20);
      local_348 = vmovlpd_avx(auVar9);
      local_338 = local_348;
      local_330 = local_340;
      Vector3<float>::Vector3((Vector3<float> *)0x7eb8a6);
      PVar15 = SamplerHandle::Get2D((SamplerHandle *)in_stack_fffffffffffff9c8);
      auVar8._8_8_ = extraout_XMM0_Qb;
      auVar8._0_4_ = PVar15.super_Tuple2<pbrt::Point2,_float>.x;
      auVar8._4_4_ = PVar15.super_Tuple2<pbrt::Point2,_float>.y;
      local_364 = vmovlpd_avx(auVar8);
      if ((*(byte *)(in_RDI + 0x68) & 1) == 0) {
        uVar16 = extraout_XMM0_Qb;
        VVar20 = SampleUniformHemisphere((Point2f *)in_stack_fffffffffffff9f0);
        local_350 = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar6._8_8_ = uVar16;
        auVar6._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_358 = vmovlpd_avx(auVar6);
        local_35c = UniformHemispherePDF();
      }
      else {
        __x = (int)&local_364;
        uVar16 = extraout_XMM0_Qb;
        VVar20 = SampleCosineHemisphere((Point2f *)in_stack_fffffffffffff9e0);
        in_stack_fffffffffffffa70 = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar7._8_8_ = uVar16;
        auVar7._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_358 = vmovlpd_avx(auVar7);
        in_stack_fffffffffffffa74 = in_stack_fffffffffffffa70;
        local_350 = in_stack_fffffffffffffa70;
        std::abs(__x);
        in_stack_fffffffffffffa6c = CosineHemispherePDF(in_stack_fffffffffffffa70);
        local_35c = in_stack_fffffffffffffa6c;
      }
      uVar16 = 0;
      if ((local_35c == 0.0) && (!NAN(local_35c))) {
        SampledSpectrum::SampledSpectrum
                  ((SampledSpectrum *)in_stack_fffffffffffff9d0,
                   (Float)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
        goto LAB_007ebc7d;
      }
      Frame::FromZ((Normal3f *)in_stack_fffffffffffff9e0);
      VVar20 = Frame::FromLocal((Frame *)CONCAT44(in_stack_fffffffffffffa74,
                                                  in_stack_fffffffffffffa70),
                                (Vector3f *)
                                CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      local_350 = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar5._8_8_ = uVar16;
      auVar5._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_358 = vmovlpd_avx(auVar5);
      Interaction::SpawnRay(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
      Ray::Ray(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      uVar17 = 0;
      bVar14 = Integrator::IntersectP
                         ((Integrator *)
                          CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                          in_stack_fffffffffffff9d0,
                          (Float)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
      if (!bVar14) {
        SVar21 = SpectrumHandle::Sample
                           ((SpectrumHandle *)in_stack_fffffffffffff9e0,
                            (SampledWavelengths *)
                            CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        auVar3._8_8_ = uVar16;
        auVar3._0_8_ = SVar21.values.values._8_8_;
        auVar4._8_8_ = uVar17;
        auVar4._0_8_ = SVar21.values.values._0_8_;
        vmovlpd_avx(auVar4);
        vmovlpd_avx(auVar3);
        Dot<float>((Vector3<float> *)in_stack_fffffffffffff9d0,
                   (Normal3<float> *)in_stack_fffffffffffff9c8);
        uVar17 = 0;
        uVar16 = 0;
        SampledSpectrum::SampledSpectrum
                  ((SampledSpectrum *)in_stack_fffffffffffff9d0,
                   (Float)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
        SVar21 = SampledSpectrum::operator*
                           ((SampledSpectrum *)
                            CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                            (SampledSpectrum *)in_stack_fffffffffffff9d0);
        auVar1._8_8_ = uVar17;
        auVar1._0_8_ = SVar21.values.values._8_8_;
        auVar2._8_8_ = uVar16;
        auVar2._0_8_ = SVar21.values.values._0_8_;
        local_10 = vmovlpd_avx(auVar2);
        local_8 = vmovlpd_avx(auVar1);
        goto LAB_007ebc7d;
      }
      goto LAB_007ebc5f;
    }
    pstd::optional<pbrt::ShapeIntersection>::operator->
              ((optional<pbrt::ShapeIntersection> *)0x7eb668);
    SurfaceInteraction::SkipIntersection
              ((SurfaceInteraction *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
               in_stack_fffffffffffffab8,in_stack_fffffffffffffab4);
  } while( true );
}

Assistant:

SampledSpectrum AOIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                 SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                 VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f);

    // Intersect _ray_ with scene and store intersection in _isect_
    pstd::optional<ShapeIntersection> si;
retry:
    si = Intersect(ray);
    if (si) {
        SurfaceInteraction &isect = si->intr;
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            goto retry;
        }

        // Compute coordinate frame based on true geometry, not shading
        // geometry.
        Normal3f n = FaceForward(isect.n, -ray.d);
        Vector3f s = Normalize(isect.dpdu);
        Vector3f t = Cross(isect.n, s);

        Vector3f wi;
        Float pdf;
        Point2f u = sampler.Get2D();
        if (cosSample) {
            wi = SampleCosineHemisphere(u);
            pdf = CosineHemispherePDF(std::abs(wi.z));
        } else {
            wi = SampleUniformHemisphere(u);
            pdf = UniformHemispherePDF();
        }
        if (pdf == 0)
            return SampledSpectrum(0.);

        Frame f = Frame::FromZ(n);
        wi = f.FromLocal(wi);

        // Divide by pi so that fully visible is one.
        Ray r = isect.SpawnRay(wi);
        if (!IntersectP(r, maxDist))
            return illuminant.Sample(lambda) * SampledSpectrum(Dot(wi, n) / (Pi * pdf));
    }
    return SampledSpectrum(0.);
}